

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVHLoader.cpp
# Opt level: O1

void __thiscall
Assimp::BVHLoader::InternReadFile
          (BVHLoader *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  pointer paVar1;
  int iVar2;
  undefined4 extraout_var;
  size_type __new_size;
  long *plVar3;
  runtime_error *prVar4;
  pointer paVar5;
  SkeletonMeshBuilder meshBuilder;
  undefined1 local_a0 [24];
  pointer pFStack_88;
  pointer local_78;
  pointer local_70;
  pointer local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::_M_assign((string *)&this->mFileName);
  paVar1 = (pointer)(local_a0 + 0x10);
  local_a0._0_8_ = paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"rb","");
  iVar2 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,local_a0._0_8_);
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  if ((pointer)local_a0._0_8_ != paVar1) {
    operator_delete((void *)local_a0._0_8_,(ulong)((long)(float *)local_a0._16_8_ + 1));
  }
  if (plVar3 != (long *)0x0) {
    __new_size = (**(code **)(*plVar3 + 0x30))(plVar3);
    if (__new_size != 0) {
      std::vector<char,_std::allocator<char>_>::resize(&this->mBuffer,__new_size);
      (**(code **)(*plVar3 + 0x10))
                (plVar3,(this->mBuffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,1);
      (this->mReader)._M_current =
           (this->mBuffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
      this->mLine = 1;
      ReadStructure(this,pScene);
      if (this->noSkeletonMesh == false) {
        SkeletonMeshBuilder::SkeletonMeshBuilder
                  ((SkeletonMeshBuilder *)local_a0,pScene,(aiNode *)0x0,false);
        if (local_70 != (pointer)0x0) {
          operator_delete(local_70,(long)local_60 - (long)local_70);
        }
        if (pFStack_88 != (pointer)0x0) {
          operator_delete(pFStack_88,(long)local_78 - (long)pFStack_88);
        }
        if ((pointer)local_a0._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_a0._0_8_,local_a0._16_8_ - local_a0._0_8_);
        }
      }
      CreateAnimation(this,pScene);
      (**(code **)(*plVar3 + 8))(plVar3);
      return;
    }
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_a0._0_8_ = paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"File is too small.","");
    std::runtime_error::runtime_error(prVar4,(string *)local_a0);
    *(undefined ***)prVar4 = &PTR__runtime_error_007fa260;
    __cxa_throw(prVar4,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_50,"Failed to open file ",pFile);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_a0._0_8_ = *plVar3;
  paVar5 = (pointer)(plVar3 + 2);
  if ((pointer)local_a0._0_8_ == paVar5) {
    local_a0._16_8_ = *(undefined8 *)paVar5;
    pFStack_88 = (pointer)plVar3[3];
    local_a0._0_8_ = paVar1;
  }
  else {
    local_a0._16_8_ = *(undefined8 *)paVar5;
  }
  local_a0._8_8_ = plVar3[1];
  *plVar3 = (long)paVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::runtime_error::runtime_error(prVar4,(string *)local_a0);
  *(undefined ***)prVar4 = &PTR__runtime_error_007fa260;
  __cxa_throw(prVar4,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void BVHLoader::InternReadFile( const std::string& pFile, aiScene* pScene, IOSystem* pIOHandler)
{
    mFileName = pFile;

    // read file into memory
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile));
    if( file.get() == NULL)
        throw DeadlyImportError( "Failed to open file " + pFile + ".");

    size_t fileSize = file->FileSize();
    if( fileSize == 0)
        throw DeadlyImportError( "File is too small.");

    mBuffer.resize( fileSize);
    file->Read( &mBuffer.front(), 1, fileSize);

    // start reading
    mReader = mBuffer.begin();
    mLine = 1;
    ReadStructure( pScene);

    if (!noSkeletonMesh) {
        // build a dummy mesh for the skeleton so that we see something at least
        SkeletonMeshBuilder meshBuilder( pScene);
    }

    // construct an animation from all the motion data we read
    CreateAnimation( pScene);
}